

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall
Database::addUser(Database *this,string *userName,string *alias,string *bio,string *password)

{
  int iVar1;
  ostream *poVar2;
  DatabaseException *this_00;
  char *errorMsg;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  errorMsg = (char *)0x0;
  std::operator+(&local_50,"insert into users (username, alias, bio, password) values (\'",userName)
  ;
  std::operator+(&local_110,&local_50,"\',\'");
  std::operator+(&local_f0,&local_110,alias);
  std::operator+(&local_d0,&local_f0,"\',\'");
  std::operator+(&local_b0,&local_d0,bio);
  std::operator+(&local_130,&local_b0,"\',\'");
  std::operator+(&error,&local_130,password);
  std::operator+(&query,&error,"\');");
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  iVar1 = sqlite3_exec(this->database,query._M_dataplus._M_p,(sqlite3_callback)0x0,(void *)0x0,
                       &errorMsg);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"User added successfully");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&query);
    return;
  }
  std::__cxx11::string::string((string *)&error,errorMsg,(allocator *)&local_130);
  sqlite3_free(errorMsg);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_70,"Error while adding user: ",&error);
  DatabaseException::DatabaseException(this_00,&local_70);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

void Database::addUser(std::string userName, std::string alias, std::string bio, std::string password)
{
	char* errorMsg = nullptr;
	std::string query = "insert into users (username, alias, bio, password) values ('" +
						userName + "','" + alias + "','" + bio + "','" + password + "');";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while adding user: " + error);
	}
	else
	{
		std::cout << "User added successfully" << std::endl;
	}
}